

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O0

char * __thiscall
spirv_cross::CompilerMSL::descriptor_address_space
          (CompilerMSL *this,uint32_t id,StorageClass storage,char *plain_address_space)

{
  bool bVar1;
  bool local_41;
  ID local_34;
  uint32_t local_30;
  bool local_29;
  uint32_t desc_set;
  bool storage_class_is_descriptor;
  char *plain_address_space_local;
  StorageClass storage_local;
  uint32_t id_local;
  CompilerMSL *this_local;
  
  _desc_set = plain_address_space;
  if (((this->msl_options).argument_buffers & 1U) != 0) {
    local_41 = true;
    if ((storage != StorageClassUniform) && (local_41 = true, storage != StorageClassStorageBuffer))
    {
      local_41 = storage == StorageClassUniformConstant;
    }
    local_29 = local_41;
    plain_address_space_local._0_4_ = storage;
    plain_address_space_local._4_4_ = id;
    _storage_local = this;
    TypedID<(spirv_cross::Types)0>::TypedID(&local_34,id);
    local_30 = Compiler::get_decoration((Compiler *)this,local_34,DecorationDescriptorSet);
    if (((local_29 & 1U) != 0) && (bVar1 = descriptor_set_is_argument_buffer(this,local_30), bVar1))
    {
      if ((this->argument_buffer_device_storage_mask & 1 << ((byte)local_30 & 0x1f)) != 0) {
        this_local = (CompilerMSL *)0x49f4f0;
        return (char *)this_local;
      }
      this_local = (CompilerMSL *)0x49731d;
      return (char *)this_local;
    }
  }
  return _desc_set;
}

Assistant:

const char *CompilerMSL::descriptor_address_space(uint32_t id, StorageClass storage, const char *plain_address_space) const
{
	if (msl_options.argument_buffers)
	{
		bool storage_class_is_descriptor = storage == StorageClassUniform ||
		                                   storage == StorageClassStorageBuffer ||
		                                   storage == StorageClassUniformConstant;

		uint32_t desc_set = get_decoration(id, DecorationDescriptorSet);
		if (storage_class_is_descriptor && descriptor_set_is_argument_buffer(desc_set))
		{
			// An awkward case where we need to emit *more* address space declarations (yay!).
			// An example is where we pass down an array of buffer pointers to leaf functions.
			// It's a constant array containing pointers to constants.
			// The pointer array is always constant however. E.g.
			// device SSBO * constant (&array)[N].
			// const device SSBO * constant (&array)[N].
			// constant SSBO * constant (&array)[N].
			// However, this only matters for argument buffers, since for MSL 1.0 style codegen,
			// we emit the buffer array on stack instead, and that seems to work just fine apparently.

			// If the argument was marked as being in device address space, any pointer to member would
			// be const device, not constant.
			if (argument_buffer_device_storage_mask & (1u << desc_set))
				return "const device";
			else
				return "constant";
		}
	}

	return plain_address_space;
}